

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O1

void readimage(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  double dVar8;
  float fVar9;
  double dVar10;
  float fVar11;
  float fVar12;
  int status;
  fitsfile *fptr;
  float local_100c;
  float local_1008;
  float nullval;
  int anynull;
  int nfound;
  long naxes [2];
  char filename [13];
  float buffer [1000];
  
  builtin_strncpy(filename + 8,".fit",5);
  builtin_strncpy(filename,"atestfil",8);
  status = 0;
  iVar2 = ffopentest(10,&fptr,filename,0);
  if (iVar2 != 0) {
    printerror(status);
  }
  iVar2 = ffgknj(fptr,"NAXIS",1,2,naxes,&nfound,&status);
  if (iVar2 != 0) {
    printerror(status);
  }
  nullval = 0.0;
  if (naxes[1] * naxes[0] < 1) {
    dVar10 = -1.0000000150474662e+30;
    dVar8 = 1.0000000150474662e+30;
  }
  else {
    lVar6 = 1;
    fVar12 = 1e+30;
    fVar11 = -1e+30;
    lVar4 = naxes[1] * naxes[0];
    do {
      lVar5 = 1000;
      if (lVar4 < 1000) {
        lVar5 = lVar4;
      }
      local_100c = fVar12;
      local_1008 = fVar11;
      iVar2 = ffgpv(fptr,0x2a,lVar6,lVar5,&nullval,buffer,&anynull,&status);
      if (iVar2 != 0) {
        printerror(status);
      }
      fVar11 = local_1008;
      fVar12 = local_100c;
      if (0 < lVar4) {
        lVar3 = 0;
        fVar7 = local_1008;
        fVar9 = local_100c;
        do {
          fVar11 = buffer[lVar3];
          fVar12 = fVar11;
          if (fVar9 <= fVar11) {
            fVar12 = fVar9;
          }
          if (fVar11 <= fVar7) {
            fVar11 = fVar7;
          }
          lVar3 = lVar3 + 1;
          fVar7 = fVar11;
          fVar9 = fVar12;
        } while (lVar5 != lVar3);
      }
      lVar6 = lVar6 + lVar5;
      lVar3 = lVar4 - lVar5;
      bVar1 = lVar5 <= lVar4;
      lVar4 = lVar3;
    } while (lVar3 != 0 && bVar1);
    dVar8 = (double)fVar12;
    dVar10 = (double)fVar11;
  }
  printf("\nMin and max image pixels =  %.0f, %.0f\n",dVar8,dVar10);
  iVar2 = ffclos(fptr,&status);
  if (iVar2 != 0) {
    printerror(status);
  }
  return;
}

Assistant:

void readimage( void )

    /************************************************************************/
    /* Read a FITS image and determine the minimum and maximum pixel values */
    /************************************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */
    int status,  nfound, anynull;
    long naxes[2], fpixel, nbuffer, npixels, ii;

#define buffsize 1000
    float datamin, datamax, nullval, buffer[buffsize];
    char filename[]  = "atestfil.fit";     /* name of existing FITS file   */

    status = 0;

    if ( fits_open_file(&fptr, filename, READONLY, &status) )
         printerror( status );

    /* read the NAXIS1 and NAXIS2 keyword to get image size */
    if ( fits_read_keys_lng(fptr, "NAXIS", 1, 2, naxes, &nfound, &status) )
         printerror( status );

    npixels  = naxes[0] * naxes[1];         /* number of pixels in the image */
    fpixel   = 1;
    nullval  = 0;                /* don't check for null values in the image */
    datamin  = 1.0E30f;
    datamax  = -1.0E30f;

    while (npixels > 0)
    {
      nbuffer = npixels;
      if (npixels > buffsize)
        nbuffer = buffsize;     /* read as many pixels as will fit in buffer */

      /* Note that even though the FITS images contains unsigned integer */
      /* pixel values (or more accurately, signed integer pixels with    */
      /* a bias of 32768),  this routine is reading the values into a    */
      /* float array.   Cfitsio automatically performs the datatype      */
      /* conversion in cases like this.                                  */

      if ( fits_read_img(fptr, TFLOAT, fpixel, nbuffer, &nullval,
                  buffer, &anynull, &status) )
           printerror( status );

      for (ii = 0; ii < nbuffer; ii++)  {
        if ( buffer[ii] < datamin )
            datamin = buffer[ii];

        if ( buffer[ii] > datamax )
            datamax = buffer[ii];
      }
      npixels -= nbuffer;    /* increment remaining number of pixels */
      fpixel  += nbuffer;    /* next pixel to be read in image */
    }

    printf("\nMin and max image pixels =  %.0f, %.0f\n", datamin, datamax);

    if ( fits_close_file(fptr, &status) )
         printerror( status );

    return;
}